

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

u32 dec_parse_abs_mvd(com_lbac_t *lbac,lbac_ctx_model_t *model)

{
  byte bVar1;
  byte bVar2;
  byte *pbVar3;
  bool bVar4;
  u32 uVar5;
  byte bVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  byte *pbVar13;
  uint uVar14;
  
  uVar5 = lbac_dec_bin(lbac,model);
  if (uVar5 == 0) {
    uVar5 = 0;
  }
  else {
    uVar5 = lbac_dec_bin(lbac,model + 1);
    if (uVar5 == 0) {
      uVar5 = 1;
    }
    else {
      uVar5 = lbac_dec_bin(lbac,model + 2);
      if (uVar5 == 0) {
        uVar5 = 2;
      }
      else {
        uVar5 = lbac_dec_bin_ep(lbac);
        iVar11 = lbac->range * 0x10000;
        iVar10 = 0;
        uVar9 = lbac->low;
        do {
          iVar12 = iVar11;
          if ((int)uVar9 <= iVar11) {
            iVar12 = 0;
          }
          uVar14 = (uVar9 - iVar12) * 2;
          if ((uVar9 & 0x7fff) == 0) {
            uVar7 = (int)(uVar14 - 1 ^ uVar14) >> 0xf;
            iVar12 = 0x1f;
            if (uVar7 != 0) {
              for (; uVar7 >> iVar12 == 0; iVar12 = iVar12 + -1) {
              }
            }
            pbVar3 = lbac->cur;
            bVar6 = *pbVar3;
            bVar1 = pbVar3[1];
            pbVar13 = pbVar3 + 2;
            if (lbac->end <= pbVar3 + 2) {
              pbVar13 = lbac->end;
            }
            lbac->cur = pbVar13;
            uVar14 = ((uint)bVar6 * 0x200 + (uint)bVar1 * 2 + -0xffff <<
                     (0x1e - ((byte)iVar12 ^ 0x1f) & 0x1f)) + uVar14;
          }
          iVar10 = iVar10 + (uint)((int)uVar9 <= iVar11);
        } while (((int)uVar9 <= iVar11) && (uVar9 = uVar14, lbac->cur < lbac->end));
        lbac->low = uVar14;
        bVar6 = (byte)iVar10;
        iVar12 = 0;
        for (; 0 < iVar10; iVar10 = iVar10 + -1) {
          bVar4 = iVar11 < (int)uVar14;
          iVar8 = 0;
          if (iVar11 < (int)uVar14) {
            iVar8 = iVar11;
          }
          uVar7 = (uVar14 - iVar8) * 2;
          uVar9 = uVar14 & 0x7fff;
          uVar14 = uVar7;
          if (uVar9 == 0) {
            uVar9 = (int)(uVar7 - 1 ^ uVar7) >> 0xf;
            iVar8 = 0x1f;
            if (uVar9 != 0) {
              for (; uVar9 >> iVar8 == 0; iVar8 = iVar8 + -1) {
              }
            }
            pbVar3 = lbac->cur;
            bVar1 = *pbVar3;
            bVar2 = pbVar3[1];
            pbVar13 = pbVar3 + 2;
            if (lbac->end <= pbVar3 + 2) {
              pbVar13 = lbac->end;
            }
            lbac->cur = pbVar13;
            uVar14 = ((uint)bVar1 * 0x200 + (uint)bVar2 * 2 + -0xffff <<
                     (0x1e - ((byte)iVar8 ^ 0x1f) & 0x1f)) + uVar7;
          }
          iVar12 = (uint)bVar4 + iVar12 * 2;
        }
        lbac->low = uVar14;
        uVar5 = (uVar5 & 1) + (iVar12 + ~(-1 << (bVar6 & 0x1f))) * 2 + 3;
      }
    }
  }
  return uVar5;
}

Assistant:

static u32 dec_parse_abs_mvd(com_lbac_t *lbac, lbac_ctx_model_t *model)
{
    u32 act_sym;

    if (!lbac_dec_bin(lbac, model)) {
        act_sym = 0;
    } else if (!lbac_dec_bin(lbac, model + 1)) {
        act_sym = 1;
    } else if (!lbac_dec_bin(lbac, model + 2)) {
        act_sym = 2;
    } else {
        int add_one = lbac_dec_bin_ep(lbac) & 1;
        int golomb_order = lbac_read_unary_sym_ep(lbac);
        act_sym = (1 << golomb_order) - 1 + lbac_read_bins_ep_msb(lbac, golomb_order);
        act_sym = 3 + act_sym * 2 + add_one;
    }

    return act_sym;
}